

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void printexpr(FILE *out,expr *expr,int lvl)

{
  int in_EDX;
  FILE *in_RSI;
  FILE *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  switch(in_RSI->_flags) {
  case 0:
    iVar1 = *(int *)((long)&in_RSI->_IO_buf_end + 4);
    if (iVar1 == 1) {
      fprintf(in_RDI,"%s",cbtarg);
    }
    else if (iVar1 == 2) {
      fprintf(in_RDI,"%s",cctarg);
    }
    else if (iVar1 == 3) {
      fprintf(in_RDI,"%s",cmem);
    }
    else {
      fprintf(in_RDI,"%s",cnum);
    }
    if (((ulong)in_RSI->_IO_read_end & 0x8000000000000000) == 0) {
      fprintf(in_RDI,"%#llx",in_RSI->_IO_read_end);
    }
    else {
      fprintf(in_RDI,"-%#llx",-(long)in_RSI->_IO_read_end);
    }
    break;
  case 1:
    iVar1 = *(int *)((long)&in_RSI->_IO_buf_end + 4);
    if (iVar1 == 1) {
      fprintf(in_RDI,"%s%s",cnum,in_RSI->_IO_read_ptr);
    }
    else if (iVar1 == 2) {
      fprintf(in_RDI,"%s%s",cunk,in_RSI->_IO_read_ptr);
    }
    else {
      fprintf(in_RDI,"%s%s",cname,in_RSI->_IO_read_ptr);
    }
    break;
  case 2:
    if (*(int *)((long)&in_RSI->_IO_buf_end + 4) == 2) {
      fprintf(in_RDI,"%s#%s",cunk,in_RSI->_IO_read_ptr);
    }
    else {
      fprintf(in_RDI,"%s#%s",cnum,in_RSI->_IO_read_ptr);
    }
    break;
  case 3:
    iVar1 = *(int *)((long)&in_RSI->_IO_buf_end + 4);
    if (iVar1 == 1) {
      fprintf(in_RDI,"%s$%s",creg1,in_RSI->_IO_read_ptr);
    }
    else if (iVar1 == 2) {
      fprintf(in_RDI,"%s$%s",cunk,in_RSI->_IO_read_ptr);
    }
    else {
      fprintf(in_RDI,"%s$%s",creg0,in_RSI->_IO_read_ptr);
    }
    break;
  case 4:
    if (in_RSI->_IO_read_ptr != (char *)0x0) {
      fprintf(in_RDI,"%s%s[",cmem,in_RSI->_IO_read_ptr);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (in_RSI->_IO_read_ptr != (char *)0x0) {
      fprintf(in_RDI,"%s]",cmem);
    }
    break;
  case 5:
    fprintf(in_RDI,"%s{",cnorm);
    for (iVar1 = 0; iVar1 < *(int *)&in_RSI->_IO_buf_base; iVar1 = iVar1 + 1) {
      fprintf(in_RDI," ");
      printexpr(in_RSI,(expr *)CONCAT44(in_EDX,iVar1),0);
    }
    fprintf(in_RDI," %s}",cnorm);
    break;
  case 6:
    fprintf(in_RDI,"%s#",creg0);
    break;
  case 7:
    fprintf(in_RDI,"%s%lld:%lld",cnum,in_RSI->_IO_read_end,in_RSI->_IO_read_base);
    break;
  case 8:
    fprintf(in_RDI,"%s-",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    break;
  case 9:
    fprintf(in_RDI,"%s~",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    break;
  case 10:
    if (6 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s*",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (6 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0xb:
    if (6 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s/",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (6 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0xc:
    if (5 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s+",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (5 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0xd:
    if (5 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s-",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (5 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0xe:
    if (4 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s<<",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (4 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0xf:
    if (4 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s>>",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (4 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0x10:
    if (3 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s&",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (3 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0x11:
    if (2 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s^",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (2 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0x12:
    if (1 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s|",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (1 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0x13:
    if (0 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s++",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (0 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0x14:
    if (0 < in_EDX) {
      fprintf(in_RDI,"%s(",cmem);
    }
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    fprintf(in_RDI,"%s--",cmem);
    printexpr(in_RSI,(expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if (0 < in_EDX) {
      fprintf(in_RDI,"%s)",cmem);
    }
    break;
  case 0x15:
    fprintf(in_RDI,"%s(",cmem);
    break;
  case 0x16:
    fprintf(in_RDI,"%s)",cmem);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/print.c"
                  ,0xdd,"void printexpr(FILE *, const struct expr *, int)");
  }
  return;
}

Assistant:

void printexpr(FILE *out, const struct expr *expr, int lvl) {
	int i;
	switch (expr->type) {
		case EXPR_NUM:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s", cbtarg);
					break;
				case 2:
					fprintf(out, "%s", cctarg);
					break;
				case 3:
					fprintf(out, "%s", cmem);
					break;
				default:
					fprintf(out, "%s", cnum);
					break;
			}
			if (expr->num1 & 1ull << 63)
				fprintf(out, "-%#llx", -expr->num1);
			else
				fprintf(out, "%#llx", expr->num1);
			return;
		case EXPR_ID:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s%s", cnum, expr->str);
					break;
				case 2:
					fprintf(out, "%s%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s%s", cname, expr->str);
					break;
			}
			return;
		case EXPR_LABEL:
			switch (expr->special) {
				case 2:
					fprintf(out, "%s#%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s#%s", cnum, expr->str);
					break;
			}
			return;
		case EXPR_REG:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s$%s", creg1, expr->str);
					break;
				case 2:
					fprintf(out, "%s$%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s$%s", creg0, expr->str);
					break;
			}
			return;
		case EXPR_MEM:
			if (expr->str)
				fprintf(out, "%s%s[", cmem, expr->str);
			printexpr(out, expr->expr1, 0);
			if (expr->str)
				fprintf(out, "%s]", cmem);
			return;
		case EXPR_VEC:
			fprintf(out, "%s{", cnorm);
			for (i = 0; i < expr->vexprsnum; i++) {
				fprintf(out, " ");
				printexpr(out, expr->vexprs[i], 0);
			}
			fprintf(out, " %s}", cnorm);
			return;
		case EXPR_DISCARD:
			fprintf(out, "%s#", creg0);
			return;
		case EXPR_BITFIELD:
			fprintf(out, "%s%lld:%lld", cnum, expr->num1, expr->num2);
			return;
		case EXPR_NEG:
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_NOT:
			fprintf(out, "%s~", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_MUL:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s*", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_DIV:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s/", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_ADD:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s+", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SUB:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHL:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s<<", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHR:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s>>", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_AND:
			if (lvl >= 4)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 3);
			fprintf(out, "%s&", cmem);
			printexpr(out, expr->expr2, 4);
			if (lvl >= 4)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_XOR:
			if (lvl >= 3)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 2);
			fprintf(out, "%s^", cmem);
			printexpr(out, expr->expr2, 3);
			if (lvl >= 3)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_OR:
			if (lvl >= 2)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 1);
			fprintf(out, "%s|", cmem);
			printexpr(out, expr->expr2, 2);
			if (lvl >= 2)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PIADD:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s++", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PISUB:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s--", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SESTART:
			fprintf(out, "%s(", cmem);
			return;
		case EXPR_SEEND:
			fprintf(out, "%s)", cmem);
			return;
		default:
			assert(0);
	}
}